

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Reshape_x86::forward(Reshape_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar39;
  undefined1 uVar41;
  undefined4 uVar42;
  undefined1 uVar43;
  undefined1 uVar45;
  undefined1 uVar47;
  undefined1 uVar49;
  undefined8 uVar50;
  undefined8 uVar57;
  undefined4 uVar64;
  undefined1 uVar65;
  undefined1 uVar67;
  undefined1 uVar69;
  undefined1 uVar71;
  undefined8 uVar72;
  undefined8 uVar79;
  void *pvVar80;
  int iVar81;
  size_t sVar82;
  long lVar83;
  ulong uVar84;
  _func_int *p_Var85;
  undefined8 *puVar86;
  undefined4 extraout_EDX;
  undefined4 uVar87;
  ulong uVar88;
  long lVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  long lVar94;
  byte bVar95;
  int iVar96;
  uint uVar97;
  long lVar98;
  long lVar99;
  int iVar100;
  ulong uVar101;
  undefined8 *puVar102;
  int iVar103;
  ulong uVar104;
  long lVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  Mat bottom_blob_unpacked;
  Mat top_blob_unpacked;
  Option opt_pack;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined4 uVar30;
  undefined3 uVar32;
  undefined2 uVar34;
  undefined3 uVar38;
  undefined2 uVar40;
  undefined4 uVar44;
  undefined3 uVar46;
  undefined2 uVar48;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined3 uVar53;
  undefined1 uVar54;
  undefined2 uVar55;
  undefined1 uVar56;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined3 uVar60;
  undefined1 uVar61;
  undefined2 uVar62;
  undefined1 uVar63;
  undefined4 uVar66;
  undefined3 uVar68;
  undefined2 uVar70;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined3 uVar75;
  undefined1 uVar76;
  undefined2 uVar77;
  undefined1 uVar78;
  
  p_Var85 = this->_vptr_Reshape_x86[-3];
  if (*(int *)(&this->field_0xe0 + (long)p_Var85) == 1) {
    opt_pack.lightmode = opt->lightmode;
    opt_pack._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack.num_threads = opt->num_threads;
    opt_pack.workspace_allocator = opt->workspace_allocator;
    opt_pack.openmp_blocktime = opt->openmp_blocktime;
    opt_pack.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack.use_int8_inference = opt->use_int8_inference;
    opt_pack.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack.use_bf16_storage = opt->use_bf16_storage;
    opt_pack.use_fp16_packed = opt->use_fp16_packed;
    opt_pack.use_fp16_storage = opt->use_fp16_storage;
    opt_pack.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack.use_int8_packed = opt->use_int8_packed;
    opt_pack.use_int8_storage = opt->use_int8_storage;
    opt_pack.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack.use_packing_layout = opt->use_packing_layout;
    opt_pack.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack.use_image_storage = opt->use_image_storage;
    opt_pack.use_tensor_storage = opt->use_tensor_storage;
    opt_pack.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_pack.flush_denormals = opt->flush_denormals;
    opt_pack.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack.use_reserved_1 = opt->use_reserved_1;
    opt_pack.use_reserved_2 = opt->use_reserved_2;
    opt_pack.use_reserved_3 = opt->use_reserved_3;
    opt_pack.use_reserved_4 = opt->use_reserved_4;
    opt_pack.use_reserved_5 = opt->use_reserved_5;
    opt_pack.use_reserved_6 = opt->use_reserved_6;
    opt_pack.use_reserved_7 = opt->use_reserved_7;
    opt_pack.use_reserved_8 = opt->use_reserved_8;
    opt_pack.use_reserved_9 = opt->use_reserved_9;
    opt_pack.use_reserved_10 = opt->use_reserved_10;
    opt_pack.use_reserved_11 = opt->use_reserved_11;
    opt_pack.blob_allocator = opt->workspace_allocator;
    bottom_blob_unpacked.cstep = 0;
    bottom_blob_unpacked.data = (void *)0x0;
    bottom_blob_unpacked.refcount._0_4_ = 0;
    bottom_blob_unpacked.refcount._4_4_ = 0;
    bottom_blob_unpacked._16_12_ = SUB1612((undefined1  [16])0x0,4);
    bottom_blob_unpacked._32_12_ = SUB1612((undefined1  [16])0x0,0);
    bottom_blob_unpacked.w = 0;
    bottom_blob_unpacked.h = 0;
    bottom_blob_unpacked.d = 0;
    bottom_blob_unpacked.c = 0;
    iVar90 = 1;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,&opt_pack);
    top_blob_unpacked.cstep = 0;
    top_blob_unpacked.data = (void *)0x0;
    top_blob_unpacked.refcount._0_4_ = 0;
    top_blob_unpacked.refcount._4_4_ = 0;
    top_blob_unpacked.elemsize = 0;
    top_blob_unpacked.elempack = 0;
    top_blob_unpacked.allocator = (Allocator *)0x0;
    top_blob_unpacked.dims = 0;
    top_blob_unpacked.w = 0;
    top_blob_unpacked.h = 0;
    top_blob_unpacked.d = 0;
    top_blob_unpacked.c = 0;
    iVar81 = Reshape::forward((Reshape *)
                              ((long)&this->_vptr_Reshape_x86 + (long)this->_vptr_Reshape_x86[-3]),
                              &bottom_blob_unpacked,&top_blob_unpacked,&opt_pack);
    if (iVar81 == 0) {
      if (opt->use_packing_layout == true) {
        auVar108._0_4_ = -(uint)((top_blob_unpacked.w & 3U) == 0);
        auVar108._4_4_ = -(uint)((top_blob_unpacked.w & 3U) == 0);
        auVar108._8_4_ = -(uint)((top_blob_unpacked.h & 3U) == 0);
        auVar108._12_4_ = -(uint)((top_blob_unpacked.h & 3U) == 0);
        uVar87 = movmskpd(extraout_EDX,auVar108);
        bVar9 = (bool)(((byte)uVar87 & 2) >> 1);
        if (top_blob_unpacked.dims != 2) {
          bVar9 = (bool)(top_blob_unpacked.dims == 1 & (byte)uVar87);
        }
        bVar10 = (top_blob_unpacked.c & 3U) == 0;
        if (1 < top_blob_unpacked.dims - 3U) {
          bVar10 = bVar9;
        }
        iVar90 = (uint)bVar10 * 3 + 1;
      }
      convert_packing(&top_blob_unpacked,top_blob,iVar90,opt);
    }
    Mat::~Mat(&top_blob_unpacked);
    Mat::~Mat(&bottom_blob_unpacked);
    return iVar81;
  }
  iVar81 = *(int *)(&this->field_0xe4 + (long)p_Var85);
  if (iVar81 == 1) {
    flatten(bottom_blob,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_001e9509;
LAB_001e9434:
    iVar81 = -100;
  }
  else {
    iVar90 = bottom_blob->elempack;
    iVar93 = bottom_blob->dims;
    iVar92 = bottom_blob->h * iVar90;
    uVar84 = bottom_blob->elemsize;
    iVar100 = iVar92 * bottom_blob->w * bottom_blob->d * bottom_blob->c;
    if (iVar81 == 2) {
      iVar81 = iVar90;
      if (iVar93 != 1) {
        iVar81 = 1;
      }
      iVar81 = bottom_blob->w * iVar81;
      if (*(int *)(&this->field_0xd0 + (long)p_Var85) != 0) {
        iVar81 = *(int *)(&this->field_0xd0 + (long)p_Var85);
      }
      iVar96 = iVar90;
      if (iVar93 != 2) {
        iVar96 = 1;
      }
      uVar97 = bottom_blob->h * iVar96;
      if (*(uint *)(&this->field_0xd4 + (long)p_Var85) != 0) {
        uVar97 = *(uint *)(&this->field_0xd4 + (long)p_Var85);
      }
      uVar104 = (ulong)uVar97;
      if (iVar81 == -1) {
        iVar81 = iVar100 / (int)uVar97;
      }
      if (uVar97 == 0xffffffff) {
        uVar104 = (long)iVar100 / (long)iVar81 & 0xffffffff;
      }
      bVar95 = (uVar104 & 3) == 0 & opt->use_packing_layout;
      sVar82 = uVar84 / (ulong)(long)iVar90 << bVar95 * '\x02';
      iVar96 = (int)uVar104;
      if (((iVar93 == 2) && (iVar92 == iVar96)) && (iVar90 == (uint)bVar95 + (uint)bVar95 * 2 + 1))
      {
        Mat::operator=(top_blob,bottom_blob);
      }
      else {
        if (bVar95 != 0) {
          Mat::Mat(&bottom_blob_unpacked,bottom_blob);
          top_blob_unpacked.data = *(void **)opt;
          top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
          uVar20 = opt->openmp_blocktime;
          uVar21 = opt->use_winograd_convolution;
          uVar23 = opt->use_sgemm_convolution;
          uVar25 = opt->use_int8_inference;
          uVar27 = opt->use_vulkan_compute;
          uVar26 = CONCAT11(uVar27,uVar25);
          uVar24 = CONCAT21(uVar26,uVar23);
          uVar22 = CONCAT31(uVar24,uVar21);
          top_blob_unpacked.allocator = *(Allocator **)&opt->use_bf16_storage;
          uVar79._0_1_ = opt->use_shader_pack8;
          uVar79._1_1_ = opt->use_subgroup_basic;
          uVar79._2_1_ = opt->use_subgroup_vote;
          uVar79._3_1_ = opt->use_subgroup_ballot;
          uVar36 = opt->use_subgroup_shuffle;
          uVar37 = opt->use_image_storage;
          uVar39 = opt->use_tensor_storage;
          uVar41 = opt->use_weight_fp16_storage;
          uVar40 = CONCAT11(uVar41,uVar39);
          uVar38 = CONCAT21(uVar40,uVar37);
          uVar79._4_4_ = CONCAT31(uVar38,uVar36);
          uVar42 = opt->flush_denormals;
          uVar43 = opt->use_local_pool_allocator;
          uVar45 = opt->use_reserved_1;
          uVar47 = opt->use_reserved_2;
          uVar49 = opt->use_reserved_3;
          uVar48 = CONCAT11(uVar49,uVar47);
          uVar46 = CONCAT21(uVar48,uVar45);
          uVar44 = CONCAT31(uVar46,uVar43);
          uVar50._0_1_ = opt->use_reserved_4;
          uVar50._1_1_ = opt->use_reserved_5;
          uVar50._2_1_ = opt->use_reserved_6;
          uVar50._3_1_ = opt->use_reserved_7;
          uVar51 = opt->use_reserved_8;
          uVar52 = opt->use_reserved_9;
          uVar54 = opt->use_reserved_10;
          uVar56 = opt->use_reserved_11;
          uVar55 = CONCAT11(uVar56,uVar54);
          uVar53 = CONCAT21(uVar55,uVar52);
          uVar50._4_4_ = CONCAT31(uVar53,uVar51);
          top_blob_unpacked.c = (int)uVar50;
          top_blob_unpacked.dims = (int)uVar79;
          top_blob_unpacked.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
          top_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          top_blob_unpacked.elempack = uVar20;
          top_blob_unpacked._28_4_ = uVar22;
          top_blob_unpacked.w = uVar79._4_4_;
          top_blob_unpacked.h = uVar42;
          top_blob_unpacked.d = uVar44;
          top_blob_unpacked._60_4_ = uVar50._4_4_;
          flatten(bottom_blob,&bottom_blob_unpacked,(Option *)&top_blob_unpacked);
          if (((bottom_blob_unpacked.data != (void *)0x0) &&
              ((long)bottom_blob_unpacked.c * bottom_blob_unpacked.cstep != 0)) &&
             ((Mat::create(top_blob,iVar81,iVar96 >> 2,sVar82,4,opt->blob_allocator),
              top_blob->data != (void *)0x0 && ((long)top_blob->c * top_blob->cstep != 0)))) {
            iVar81 = top_blob->w;
            lVar83 = (long)iVar81;
            uVar88 = 0;
            uVar104 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar104 = uVar88;
            }
            lVar94 = lVar83 * 0xc;
            lVar99 = lVar83 * 0x10;
            lVar98 = lVar83 * 8;
            lVar83 = lVar83 << 2;
            for (uVar101 = 0; uVar101 != uVar104; uVar101 = uVar101 + 1) {
              iVar92 = (int)uVar88;
              lVar105 = top_blob->elemsize * uVar101 * (long)top_blob->w;
              pvVar4 = top_blob->data;
              lVar89 = 0;
              for (iVar96 = 0; iVar96 + 3 < iVar81; iVar96 = iVar96 + 4) {
                puVar1 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + (long)iVar92 * 4)
                ;
                uVar87 = puVar1[1];
                puVar3 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar83);
                uVar11 = puVar3[1];
                puVar2 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar98);
                uVar12 = *puVar2;
                uVar13 = puVar2[1];
                uVar14 = puVar2[2];
                uVar15 = puVar2[3];
                puVar2 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar94);
                uVar16 = *puVar2;
                uVar17 = puVar2[1];
                uVar18 = puVar2[2];
                uVar19 = puVar2[3];
                auVar106._0_8_ = CONCAT44(puVar3[2],puVar1[2]);
                auVar106._8_4_ = puVar1[3];
                auVar106._12_4_ = puVar3[3];
                puVar86 = (undefined8 *)((long)pvVar4 + lVar89 * 4 + lVar105);
                *puVar86 = CONCAT44(*puVar3,*puVar1);
                puVar86[1] = CONCAT44(uVar16,uVar12);
                puVar1 = (undefined4 *)((long)pvVar4 + lVar89 * 4 + lVar105 + 0x10);
                *puVar1 = uVar87;
                puVar1[1] = uVar11;
                puVar1[2] = uVar13;
                puVar1[3] = uVar17;
                auVar7._8_4_ = uVar14;
                auVar7._0_8_ = auVar106._0_8_;
                auVar7._12_4_ = uVar18;
                *(undefined1 (*) [16])((long)pvVar4 + lVar89 * 4 + lVar105 + 0x20) = auVar7;
                auVar5._8_4_ = uVar15;
                auVar5._0_8_ = auVar106._8_8_;
                auVar5._12_4_ = uVar19;
                *(undefined1 (*) [16])((long)pvVar4 + lVar89 * 4 + lVar105 + 0x30) = auVar5;
                lVar89 = lVar89 + 0x10;
              }
              for (; iVar96 < iVar81; iVar96 = iVar96 + 1) {
                *(undefined4 *)((long)pvVar4 + lVar89 * 4 + lVar105) =
                     *(undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + (long)iVar92 * 4);
                *(undefined4 *)((long)pvVar4 + lVar89 * 4 + lVar105 + 4) =
                     *(undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar83);
                *(undefined4 *)((long)pvVar4 + lVar89 * 4 + lVar105 + 8) =
                     *(undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar98);
                *(undefined4 *)((long)pvVar4 + lVar89 * 4 + lVar105 + 0xc) =
                     *(undefined4 *)((long)bottom_blob_unpacked.data + lVar89 + lVar94);
                lVar89 = lVar89 + 4;
              }
              lVar94 = lVar94 + lVar99;
              lVar98 = lVar98 + lVar99;
              lVar83 = lVar83 + lVar99;
              uVar88 = (ulong)(uint)(iVar92 + iVar81 * 4);
            }
            Mat::~Mat(&bottom_blob_unpacked);
            p_Var85 = this->_vptr_Reshape_x86[-3];
            iVar81 = *(int *)(&this->field_0xe4 + (long)p_Var85);
            goto LAB_001e8ff2;
          }
          goto LAB_001e942a;
        }
        flatten(bottom_blob,top_blob,opt);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        top_blob->dims = 2;
        top_blob->w = iVar81;
        top_blob->h = iVar96;
        top_blob->cstep = (long)iVar96 * (long)iVar81;
        top_blob->elemsize = sVar82;
        top_blob->elempack = 1;
      }
    }
    else {
LAB_001e8ff2:
      iVar92 = 1;
      if (iVar81 - 3U < 2) {
        iVar96 = *(int *)(&this->field_0xd8 + (long)p_Var85);
        iVar91 = iVar90;
        if (iVar93 != 1) {
          iVar91 = iVar92;
        }
        uVar97 = *(uint *)(&this->field_0xdc + (long)p_Var85);
        iVar91 = iVar91 * bottom_blob->w;
        if (*(int *)(&this->field_0xd0 + (long)p_Var85) != 0) {
          iVar91 = *(int *)(&this->field_0xd0 + (long)p_Var85);
        }
        iVar103 = iVar90;
        if (iVar93 != 2) {
          iVar103 = iVar92;
        }
        iVar103 = iVar103 * bottom_blob->h;
        if (*(int *)(&this->field_0xd4 + (long)p_Var85) != 0) {
          iVar103 = *(int *)(&this->field_0xd4 + (long)p_Var85);
        }
        if (iVar81 == 3) {
          if (iVar93 == 3) {
            iVar92 = iVar90;
          }
          if (uVar97 == 0) {
            uVar97 = iVar92 * bottom_blob->c;
          }
          if (iVar91 == -1) {
            iVar91 = (int)((long)((ulong)(uint)((int)((long)iVar100 / (long)(int)uVar97) >> 0x1f) <<
                                  0x20 | (long)iVar100 / (long)(int)uVar97 & 0xffffffffU) /
                          (long)iVar103);
          }
          if (iVar103 == -1) {
            iVar103 = (int)((long)((ulong)(uint)((int)((long)iVar100 / (long)(int)uVar97) >> 0x1f)
                                   << 0x20 | (long)iVar100 / (long)(int)uVar97 & 0xffffffffU) /
                           (long)iVar91);
          }
          if (uVar97 == 0xffffffff) {
LAB_001e90fc:
            uVar97 = (uint)((long)((ulong)(uint)((int)((long)iVar100 / (long)iVar103) >> 0x1f) <<
                                   0x20 | (long)iVar100 / (long)iVar103 & 0xffffffffU) /
                           (long)iVar91);
          }
        }
        else {
          if (iVar96 == 0) {
            iVar96 = bottom_blob->d;
          }
          if (uVar97 == 0) {
            if (iVar93 - 3U < 2) {
              iVar92 = iVar90;
            }
            uVar97 = iVar92 * bottom_blob->c;
          }
          if (iVar91 == -1) {
            uVar104 = (long)((ulong)(uint)((int)((long)iVar100 / (long)(int)uVar97) >> 0x1f) << 0x20
                            | (long)iVar100 / (long)(int)uVar97 & 0xffffffffU) / (long)iVar96;
            iVar91 = (int)((long)((ulong)(uint)((int)uVar104 >> 0x1f) << 0x20 | uVar104 & 0xffffffff
                                 ) / (long)iVar103);
          }
          if (iVar103 == -1) {
            uVar104 = (long)((ulong)(uint)((int)((long)iVar100 / (long)(int)uVar97) >> 0x1f) << 0x20
                            | (long)iVar100 / (long)(int)uVar97 & 0xffffffffU) / (long)iVar96;
            iVar103 = (int)((long)((ulong)(uint)((int)uVar104 >> 0x1f) << 0x20 |
                                  uVar104 & 0xffffffff) / (long)iVar91);
          }
          if (iVar96 == -1) {
            uVar104 = (long)((ulong)(uint)((int)((long)iVar100 / (long)(int)uVar97) >> 0x1f) << 0x20
                            | (long)iVar100 / (long)(int)uVar97 & 0xffffffffU) / (long)iVar103;
            iVar96 = (int)((long)((ulong)(uint)((int)uVar104 >> 0x1f) << 0x20 | uVar104 & 0xffffffff
                                 ) / (long)iVar91);
          }
          if (uVar97 == 0xffffffff) {
            iVar100 = iVar100 / iVar96;
            goto LAB_001e90fc;
          }
        }
        bVar95 = (uVar97 & 3) == 0 & opt->use_packing_layout;
        iVar81 = (uint)bVar95 + (uint)bVar95 * 2 + 1;
        sVar82 = uVar84 / (ulong)(long)iVar90 << bVar95 * '\x02';
        if (iVar93 == 4) {
          if ((bottom_blob->c * iVar90 != uVar97) || (iVar90 != iVar81)) goto LAB_001e91a8;
          Mat::operator=(top_blob,bottom_blob);
          top_blob->w = iVar91;
          top_blob->h = iVar103;
          top_blob->d = iVar96;
        }
        else {
          if (((iVar93 != 3) || (bottom_blob->c * iVar90 != uVar97)) || (iVar90 != iVar81)) {
LAB_001e91a8:
            Mat::Mat(&bottom_blob_unpacked,bottom_blob);
            top_blob_unpacked.data = *(void **)opt;
            top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
            uVar28 = opt->openmp_blocktime;
            uVar29 = opt->use_winograd_convolution;
            uVar31 = opt->use_sgemm_convolution;
            uVar33 = opt->use_int8_inference;
            uVar35 = opt->use_vulkan_compute;
            uVar34 = CONCAT11(uVar35,uVar33);
            uVar32 = CONCAT21(uVar34,uVar31);
            uVar30 = CONCAT31(uVar32,uVar29);
            top_blob_unpacked.allocator = *(Allocator **)&opt->use_bf16_storage;
            uVar57._0_1_ = opt->use_shader_pack8;
            uVar57._1_1_ = opt->use_subgroup_basic;
            uVar57._2_1_ = opt->use_subgroup_vote;
            uVar57._3_1_ = opt->use_subgroup_ballot;
            uVar58 = opt->use_subgroup_shuffle;
            uVar59 = opt->use_image_storage;
            uVar61 = opt->use_tensor_storage;
            uVar63 = opt->use_weight_fp16_storage;
            uVar62 = CONCAT11(uVar63,uVar61);
            uVar60 = CONCAT21(uVar62,uVar59);
            uVar57._4_4_ = CONCAT31(uVar60,uVar58);
            uVar64 = opt->flush_denormals;
            uVar65 = opt->use_local_pool_allocator;
            uVar67 = opt->use_reserved_1;
            uVar69 = opt->use_reserved_2;
            uVar71 = opt->use_reserved_3;
            uVar70 = CONCAT11(uVar71,uVar69);
            uVar68 = CONCAT21(uVar70,uVar67);
            uVar66 = CONCAT31(uVar68,uVar65);
            uVar72._0_1_ = opt->use_reserved_4;
            uVar72._1_1_ = opt->use_reserved_5;
            uVar72._2_1_ = opt->use_reserved_6;
            uVar72._3_1_ = opt->use_reserved_7;
            uVar73 = opt->use_reserved_8;
            uVar74 = opt->use_reserved_9;
            uVar76 = opt->use_reserved_10;
            uVar78 = opt->use_reserved_11;
            uVar77 = CONCAT11(uVar78,uVar76);
            uVar75 = CONCAT21(uVar77,uVar74);
            uVar72._4_4_ = CONCAT31(uVar75,uVar73);
            top_blob_unpacked.c = (int)uVar72;
            top_blob_unpacked.dims = (int)uVar57;
            top_blob_unpacked.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
            top_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20)
            ;
            top_blob_unpacked.elempack = uVar28;
            top_blob_unpacked._28_4_ = uVar30;
            top_blob_unpacked.w = uVar57._4_4_;
            top_blob_unpacked.h = uVar64;
            top_blob_unpacked.d = uVar66;
            top_blob_unpacked._60_4_ = uVar72._4_4_;
            flatten(bottom_blob,&bottom_blob_unpacked,(Option *)&top_blob_unpacked);
            if ((bottom_blob_unpacked.data != (void *)0x0) &&
               ((long)bottom_blob_unpacked.c * bottom_blob_unpacked.cstep != 0)) {
              if (*(int *)(&this->field_0xe4 + (long)this->_vptr_Reshape_x86[-3]) == 3) {
                Mat::create(top_blob,iVar91,iVar103,(int)uVar97 / iVar81,sVar82,iVar81,
                            opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,iVar91,iVar103,iVar96,(int)uVar97 / iVar81,sVar82,iVar81,
                            opt->blob_allocator);
              }
              if ((top_blob->data != (void *)0x0) &&
                 (uVar84 = (ulong)top_blob->c, top_blob->cstep * uVar84 != 0)) {
                iVar81 = top_blob->h * top_blob->w * top_blob->d;
                if (bVar95 == 0) {
                  lVar98 = 0;
                  for (lVar83 = 0; pvVar4 = bottom_blob_unpacked.data, lVar83 < (int)uVar84;
                      lVar83 = lVar83 + 1) {
                    Mat::channel(&top_blob_unpacked,top_blob,(int)lVar83);
                    pvVar80 = top_blob_unpacked.data;
                    puVar102 = (undefined8 *)(lVar83 * iVar81 * 4 + (long)pvVar4);
                    Mat::~Mat(&top_blob_unpacked);
                    lVar94 = 0;
                    puVar86 = (undefined8 *)pvVar80;
                    for (iVar90 = 0; iVar90 + 3 < iVar81; iVar90 = iVar90 + 4) {
                      uVar79 = puVar102[1];
                      *puVar86 = *puVar102;
                      puVar86[1] = uVar79;
                      puVar102 = puVar102 + 2;
                      puVar86 = puVar86 + 2;
                      lVar94 = lVar94 + 4;
                    }
                    for (; (int)lVar94 < iVar81; lVar94 = lVar94 + 1) {
                      *(undefined4 *)((long)pvVar80 + lVar94 * 4) =
                           *(undefined4 *)((long)pvVar4 + lVar94 * 4 + lVar98);
                    }
                    uVar84 = (ulong)(uint)top_blob->c;
                    lVar98 = lVar98 + (long)iVar81 * 4;
                  }
                }
                else {
                  lVar99 = (long)iVar81;
                  lVar83 = lVar99 * 4;
                  lVar98 = lVar99 * 0x10;
                  lVar89 = lVar99 * 0xc;
                  lVar99 = lVar99 << 3;
                  iVar90 = 0;
                  for (lVar94 = 0; pvVar4 = bottom_blob_unpacked.data, lVar94 < (int)uVar84;
                      lVar94 = lVar94 + 1) {
                    Mat::channel(&top_blob_unpacked,top_blob,(int)lVar94);
                    pvVar80 = top_blob_unpacked.data;
                    Mat::~Mat(&top_blob_unpacked);
                    lVar105 = 0;
                    for (iVar93 = 0; iVar93 + 3 < iVar81; iVar93 = iVar93 + 4) {
                      puVar3 = (undefined4 *)((long)pvVar4 + lVar105 + (long)iVar90 * 4);
                      uVar87 = puVar3[1];
                      puVar1 = (undefined4 *)((long)pvVar4 + lVar105 + lVar83);
                      uVar11 = puVar1[1];
                      puVar2 = (undefined4 *)((long)pvVar4 + lVar105 + lVar99);
                      uVar12 = *puVar2;
                      uVar13 = puVar2[1];
                      uVar14 = puVar2[2];
                      uVar15 = puVar2[3];
                      puVar2 = (undefined4 *)((long)pvVar4 + lVar105 + lVar89);
                      uVar16 = *puVar2;
                      uVar17 = puVar2[1];
                      uVar18 = puVar2[2];
                      uVar19 = puVar2[3];
                      auVar107._0_8_ = CONCAT44(puVar1[2],puVar3[2]);
                      auVar107._8_4_ = puVar3[3];
                      auVar107._12_4_ = puVar1[3];
                      puVar86 = (undefined8 *)((long)pvVar80 + lVar105 * 4);
                      *puVar86 = CONCAT44(*puVar1,*puVar3);
                      puVar86[1] = CONCAT44(uVar16,uVar12);
                      puVar1 = (undefined4 *)((long)pvVar80 + lVar105 * 4 + 0x10);
                      *puVar1 = uVar87;
                      puVar1[1] = uVar11;
                      puVar1[2] = uVar13;
                      puVar1[3] = uVar17;
                      auVar8._8_4_ = uVar14;
                      auVar8._0_8_ = auVar107._0_8_;
                      auVar8._12_4_ = uVar18;
                      *(undefined1 (*) [16])((long)pvVar80 + lVar105 * 4 + 0x20) = auVar8;
                      auVar6._8_4_ = uVar15;
                      auVar6._0_8_ = auVar107._8_8_;
                      auVar6._12_4_ = uVar19;
                      *(undefined1 (*) [16])((long)pvVar80 + lVar105 * 4 + 0x30) = auVar6;
                      lVar105 = lVar105 + 0x10;
                    }
                    for (; iVar93 < iVar81; iVar93 = iVar93 + 1) {
                      *(undefined4 *)((long)pvVar80 + lVar105 * 4) =
                           *(undefined4 *)((long)pvVar4 + lVar105 + (long)iVar90 * 4);
                      *(undefined4 *)((long)pvVar80 + lVar105 * 4 + 4) =
                           *(undefined4 *)((long)pvVar4 + lVar105 + lVar83);
                      *(undefined4 *)((long)pvVar80 + lVar105 * 4 + 8) =
                           *(undefined4 *)((long)pvVar4 + lVar105 + lVar99);
                      *(undefined4 *)((long)pvVar80 + lVar105 * 4 + 0xc) =
                           *(undefined4 *)((long)pvVar4 + lVar105 + lVar89);
                      lVar105 = lVar105 + 4;
                    }
                    uVar84 = (ulong)(uint)top_blob->c;
                    iVar90 = iVar90 + iVar81 * 4;
                    lVar83 = lVar83 + lVar98;
                    lVar99 = lVar99 + lVar98;
                    lVar89 = lVar89 + lVar98;
                  }
                }
                Mat::~Mat(&bottom_blob_unpacked);
                goto LAB_001e9509;
              }
            }
LAB_001e942a:
            Mat::~Mat(&bottom_blob_unpacked);
            goto LAB_001e9434;
          }
          Mat::operator=(top_blob,bottom_blob);
          top_blob->w = iVar91;
          top_blob->h = iVar103;
        }
      }
    }
LAB_001e9509:
    iVar81 = 0;
  }
  return iVar81;
}

Assistant:

int Reshape_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (permute == 1)
    {
        // TODO implement permute on-the-fly
        Option opt_pack = opt;
        opt_pack.blob_allocator = opt.workspace_allocator;

        Mat bottom_blob_unpacked;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

        Mat top_blob_unpacked;
        int ret = Reshape::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
        if (ret != 0)
            return ret;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            // resolve dst_elempack
            int dims = top_blob_unpacked.dims;
#if __AVX__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#else
            if (dims == 1) out_elempack = top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);

        return 0;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (_h == 0)
            _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#else
            out_elempack = _h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == _h && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.cstep = (size_t)_w * _h;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(_w, _h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int outw = top_blob.w;
        int outh = top_blob.h;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        int _w = w;
        int _h = h;
        int _d = d;
        int _c = c;

        if (ndim == 3)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_c == 0)
                _c = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _h;
            if (_h == -1)
                _h = total / _c / _w;
            if (_c == -1)
                _c = total / _h / _w;
        }
        else // if (ndim == 4)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_d == 0)
                _d = bottom_blob.d;
            if (_c == 0)
                _c = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _d / _h;
            if (_h == -1)
                _h = total / _c / _d / _w;
            if (_d == -1)
                _d = total / _c / _h / _w;
            if (_c == -1)
                _c = total / _d / _h / _w;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#else
            out_elempack = _c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            return 0;
        }
        if (dims == 4 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.d = _d;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(_w, _h, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(_w, _h, _d, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}